

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdbmp.c
# Opt level: O1

void start_input_bmp(j_compress_ptr cinfo,cjpeg_source_ptr sinfo)

{
  int *piVar1;
  J_COLOR_SPACE JVar2;
  jpeg_error_mgr *pjVar3;
  undefined8 *puVar4;
  _func_JDIMENSION_j_compress_ptr_cjpeg_source_ptr *p_Var5;
  bool bVar6;
  int iVar7;
  int iVar8;
  cd_progress_ptr progress;
  size_t sVar9;
  JSAMPARRAY ppJVar10;
  ulong uVar11;
  jvirt_sarray_ptr pjVar12;
  _func_void_j_compress_ptr_cjpeg_source_ptr *p_Var13;
  code *pcVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  U_CHAR bmpinfoheader [64];
  U_CHAR bmpfileheader [14];
  short local_a6;
  int local_88;
  uint local_84;
  undefined4 local_80;
  short local_7c;
  ushort local_7a;
  int local_78;
  uint local_70;
  uint local_6c;
  uint local_68;
  short local_3e [5];
  int local_34;
  
  sVar9 = fread(local_3e,1,0xe,(FILE *)sinfo->input_file);
  if (sVar9 != 0xe) {
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x2b;
    (*pjVar3->error_exit)((j_common_ptr)cinfo);
  }
  if (local_3e[0] != 0x4d42) {
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x3f0;
    (*pjVar3->error_exit)((j_common_ptr)cinfo);
  }
  sVar9 = fread(&local_88,1,4,(FILE *)sinfo->input_file);
  if (sVar9 != 4) {
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x2b;
    (*pjVar3->error_exit)((j_common_ptr)cinfo);
  }
  if ((local_88 - 0x41U < 0xffffffcb) || (local_34 < local_88 + 0xe)) {
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x3eb;
    (*pjVar3->error_exit)((j_common_ptr)cinfo);
  }
  sVar9 = fread(&local_84,1,(long)(local_88 + -4),(FILE *)sinfo->input_file);
  if (sVar9 != (long)(local_88 + -4)) {
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x2b;
    (*pjVar3->error_exit)((j_common_ptr)cinfo);
  }
  if ((local_88 == 0x40) || (local_88 == 0x28)) {
    local_a6 = local_7c;
    *(uint *)&sinfo[1].buffer = (uint)local_7a;
    if ((local_7a == 0x20) || (local_7a == 0x18)) {
      pjVar3 = cinfo->err;
      (pjVar3->msg_parm).i[0] = local_84;
      (pjVar3->msg_parm).i[1] = local_80;
      (pjVar3->msg_parm).i[2] = *(int *)&sinfo[1].buffer;
      pjVar3->msg_code = 0x3f2;
      (*pjVar3->emit_message)((j_common_ptr)cinfo,1);
LAB_001065d1:
      iVar8 = 0;
    }
    else {
      if (local_7a != 8) {
        pjVar3 = cinfo->err;
        pjVar3->msg_code = 0x3ea;
        (*pjVar3->error_exit)((j_common_ptr)cinfo);
        goto LAB_001065d1;
      }
      pjVar3 = cinfo->err;
      pjVar3->msg_code = 0x3f3;
      (pjVar3->msg_parm).i[0] = local_84;
      (cinfo->err->msg_parm).i[1] = local_80;
      (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
      iVar8 = 4;
    }
    if (local_78 != 0) {
      pjVar3 = cinfo->err;
      pjVar3->msg_code = 0x3ee;
      (*pjVar3->error_exit)((j_common_ptr)cinfo);
    }
    uVar19 = local_80;
    uVar15 = local_68;
    uVar16 = local_84;
    if ((0 < (int)local_70) && (0 < (int)local_6c)) {
      cinfo->X_density = (UINT16)(local_70 / 100);
      cinfo->Y_density = (UINT16)(local_6c / 100);
      cinfo->density_unit = '\x02';
    }
  }
  else {
    if (local_88 != 0xc) {
      pjVar3 = cinfo->err;
      pjVar3->msg_code = 0x3eb;
      (*pjVar3->error_exit)((j_common_ptr)cinfo);
      return;
    }
    uVar19 = local_84 >> 0x10;
    *(uint *)&sinfo[1].buffer = (uint)local_80._2_2_;
    local_a6 = (short)local_80;
    uVar16 = local_84 & 0xffff;
    if ((local_80._2_2_ == 0x20) || (local_80._2_2_ == 0x18)) {
      pjVar3 = cinfo->err;
      (pjVar3->msg_parm).i[0] = local_84 & 0xffff;
      (pjVar3->msg_parm).i[1] = uVar19;
      (pjVar3->msg_parm).i[2] = *(int *)&sinfo[1].buffer;
      pjVar3->msg_code = 0x3f4;
      (*pjVar3->emit_message)((j_common_ptr)cinfo,1);
    }
    else {
      if (local_80._2_2_ == 8) {
        pjVar3 = cinfo->err;
        pjVar3->msg_code = 0x3f5;
        (pjVar3->msg_parm).i[0] = local_84 & 0xffff;
        (cinfo->err->msg_parm).i[1] = uVar19;
        (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
        iVar8 = 3;
        uVar15 = 0;
        goto LAB_00106655;
      }
      pjVar3 = cinfo->err;
      pjVar3->msg_code = 0x3ea;
      (*pjVar3->error_exit)((j_common_ptr)cinfo);
    }
    iVar8 = 0;
    uVar15 = 0;
  }
LAB_00106655:
  if (((int)uVar16 < 1) || ((int)uVar19 < 1)) {
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x3ef;
    (*pjVar3->error_exit)((j_common_ptr)cinfo);
  }
  if (local_a6 != 1) {
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x3ec;
    (*pjVar3->error_exit)((j_common_ptr)cinfo);
  }
  iVar18 = local_34 - (local_88 + 0xe);
  if (iVar8 != 0) {
    if ((int)uVar15 < 1) {
      uVar15 = 0x100;
    }
    else if (0x100 < (int)uVar15) {
      pjVar3 = cinfo->err;
      pjVar3->msg_code = 0x3e9;
      (*pjVar3->error_exit)((j_common_ptr)cinfo);
    }
    bVar6 = true;
    ppJVar10 = (*cinfo->mem->alloc_sarray)((j_common_ptr)cinfo,1,uVar15,3);
    sinfo[1].get_pixel_rows = (_func_JDIMENSION_j_compress_ptr_cjpeg_source_ptr *)ppJVar10;
    *(uint *)((long)&sinfo[1].buffer + 4) = uVar15;
    if (iVar8 == 3) {
      uVar17 = 0;
      do {
        iVar7 = getc((FILE *)sinfo->input_file);
        if (iVar7 == -1) {
          puVar4 = *(undefined8 **)sinfo[1].start_input;
          *(undefined4 *)(puVar4 + 5) = 0x2b;
          (*(code *)*puVar4)();
        }
        *(char *)(*(long *)(sinfo[1].get_pixel_rows + 0x10) + uVar17) = (char)iVar7;
        iVar7 = getc((FILE *)sinfo->input_file);
        if (iVar7 == -1) {
          puVar4 = *(undefined8 **)sinfo[1].start_input;
          *(undefined4 *)(puVar4 + 5) = 0x2b;
          (*(code *)*puVar4)();
        }
        *(char *)(*(long *)(sinfo[1].get_pixel_rows + 8) + uVar17) = (char)iVar7;
        iVar7 = getc((FILE *)sinfo->input_file);
        if (iVar7 == -1) {
          puVar4 = *(undefined8 **)sinfo[1].start_input;
          *(undefined4 *)(puVar4 + 5) = 0x2b;
          (*(code *)*puVar4)();
        }
        *(char *)(*(long *)sinfo[1].get_pixel_rows + uVar17) = (char)iVar7;
        p_Var5 = sinfo[1].get_pixel_rows;
        if ((*(char *)(*(long *)(p_Var5 + 0x10) + uVar17) !=
             *(char *)(*(long *)(p_Var5 + 8) + uVar17)) ||
           (*(char *)(*(long *)(p_Var5 + 8) + uVar17) != *(char *)(*(long *)p_Var5 + uVar17))) {
          bVar6 = false;
        }
        uVar17 = uVar17 + 1;
      } while (uVar15 != uVar17);
    }
    else if (iVar8 == 4) {
      bVar6 = true;
      uVar17 = 0;
      do {
        iVar7 = getc((FILE *)sinfo->input_file);
        if (iVar7 == -1) {
          puVar4 = *(undefined8 **)sinfo[1].start_input;
          *(undefined4 *)(puVar4 + 5) = 0x2b;
          (*(code *)*puVar4)();
        }
        *(char *)(*(long *)(sinfo[1].get_pixel_rows + 0x10) + uVar17) = (char)iVar7;
        iVar7 = getc((FILE *)sinfo->input_file);
        if (iVar7 == -1) {
          puVar4 = *(undefined8 **)sinfo[1].start_input;
          *(undefined4 *)(puVar4 + 5) = 0x2b;
          (*(code *)*puVar4)();
        }
        *(char *)(*(long *)(sinfo[1].get_pixel_rows + 8) + uVar17) = (char)iVar7;
        iVar7 = getc((FILE *)sinfo->input_file);
        if (iVar7 == -1) {
          puVar4 = *(undefined8 **)sinfo[1].start_input;
          *(undefined4 *)(puVar4 + 5) = 0x2b;
          (*(code *)*puVar4)();
        }
        *(char *)(*(long *)sinfo[1].get_pixel_rows + uVar17) = (char)iVar7;
        iVar7 = getc((FILE *)sinfo->input_file);
        if (iVar7 == -1) {
          puVar4 = *(undefined8 **)sinfo[1].start_input;
          *(undefined4 *)(puVar4 + 5) = 0x2b;
          (*(code *)*puVar4)();
        }
        p_Var5 = sinfo[1].get_pixel_rows;
        if ((*(char *)(*(long *)(p_Var5 + 0x10) + uVar17) !=
             *(char *)(*(long *)(p_Var5 + 8) + uVar17)) ||
           (*(char *)(*(long *)(p_Var5 + 8) + uVar17) != *(char *)(*(long *)p_Var5 + uVar17))) {
          bVar6 = false;
        }
        uVar17 = uVar17 + 1;
      } while (uVar15 != uVar17);
    }
    else {
      puVar4 = *(undefined8 **)sinfo[1].start_input;
      *(undefined4 *)(puVar4 + 5) = 0x3e9;
      (*(code *)*puVar4)();
      bVar6 = true;
    }
    p_Var13 = sinfo[1].start_input;
    if (bVar6 && *(int *)(p_Var13 + 0x3c) == 0) {
      *(undefined4 *)(p_Var13 + 0x3c) = 1;
    }
    if (*(int *)(p_Var13 + 0x3c) == 1 && !bVar6) {
      puVar4 = *(undefined8 **)p_Var13;
      *(undefined4 *)(puVar4 + 5) = 9;
      (*(code *)*puVar4)();
    }
    iVar18 = iVar18 - uVar15 * iVar8;
  }
  if (iVar18 < 0) {
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x3eb;
    (*pjVar3->error_exit)((j_common_ptr)cinfo);
  }
  if (0 < iVar18) {
    iVar18 = iVar18 + 1;
    do {
      iVar8 = getc((FILE *)sinfo->input_file);
      if (iVar8 == -1) {
        puVar4 = *(undefined8 **)sinfo[1].start_input;
        *(undefined4 *)(puVar4 + 5) = 0x2b;
        (*(code *)*puVar4)();
      }
      iVar18 = iVar18 + -1;
    } while (1 < iVar18);
  }
  iVar8 = *(int *)&sinfo[1].buffer;
  uVar17 = (ulong)(int)uVar16;
  if (iVar8 == 0x20) {
    if (cinfo->in_color_space == JCS_UNKNOWN) {
      cinfo->in_color_space = JCS_EXT_BGRA;
    }
    JVar2 = cinfo->in_color_space;
    if ((ulong)JVar2 == 2 || JVar2 - JCS_EXT_RGB < 10) {
      cinfo->input_components = rgb_pixelsize[JVar2];
    }
    else if (JVar2 == JCS_CMYK) {
      cinfo->input_components = 4;
    }
    else {
      pjVar3 = cinfo->err;
      pjVar3->msg_code = 9;
      (*pjVar3->error_exit)((j_common_ptr)cinfo);
    }
    if ((int)(uVar17 >> 0x1e) != 0) {
      pjVar3 = cinfo->err;
      pjVar3->msg_code = 0x46;
      (*pjVar3->error_exit)((j_common_ptr)cinfo);
    }
    uVar15 = uVar16 * 4;
  }
  else if (iVar8 == 0x18) {
    if (cinfo->in_color_space == JCS_UNKNOWN) {
      cinfo->in_color_space = JCS_EXT_BGR;
    }
    JVar2 = cinfo->in_color_space;
    if ((ulong)JVar2 == 2 || JVar2 - JCS_EXT_RGB < 10) {
      cinfo->input_components = rgb_pixelsize[JVar2];
    }
    else if (JVar2 == JCS_CMYK) {
      cinfo->input_components = 4;
    }
    else {
      pjVar3 = cinfo->err;
      pjVar3->msg_code = 9;
      (*pjVar3->error_exit)((j_common_ptr)cinfo);
    }
    if (uVar17 * 3 >> 0x20 != 0) {
      pjVar3 = cinfo->err;
      pjVar3->msg_code = 0x46;
      (*pjVar3->error_exit)((j_common_ptr)cinfo);
    }
    uVar15 = uVar16 * 3;
  }
  else if (iVar8 == 8) {
    if (cinfo->in_color_space == JCS_UNKNOWN) {
      cinfo->in_color_space = JCS_EXT_RGB;
    }
    JVar2 = cinfo->in_color_space;
    uVar11 = (ulong)JVar2;
    uVar15 = uVar16;
    if (uVar11 == 2 || JVar2 - JCS_EXT_RGB < 10) {
      cinfo->input_components = rgb_pixelsize[uVar11];
    }
    else if (uVar11 == 4) {
      cinfo->input_components = 4;
    }
    else if (JVar2 == JCS_GRAYSCALE) {
      cinfo->input_components = 1;
    }
    else {
      pjVar3 = cinfo->err;
      pjVar3->msg_code = 9;
      (*pjVar3->error_exit)((j_common_ptr)cinfo);
    }
  }
  else {
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x3ea;
    (*pjVar3->error_exit)((j_common_ptr)cinfo);
    uVar15 = 0;
  }
  uVar15 = (-uVar15 & 3) + uVar15;
  *(uint *)((long)&sinfo[1].input_file + 4) = uVar15;
  if (sinfo[1].buffer_height == 0) {
    p_Var13 = (_func_void_j_compress_ptr_cjpeg_source_ptr *)
              (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,(ulong)uVar15);
    sinfo[2].start_input = p_Var13;
    iVar8 = *(int *)&sinfo[1].buffer;
    if (iVar8 == 0x20) {
      pcVar14 = get_32bit_row;
    }
    else if (iVar8 == 0x18) {
      pcVar14 = get_24bit_row;
    }
    else {
      if (iVar8 != 8) {
        pjVar3 = cinfo->err;
        pjVar3->msg_code = 0x3ea;
        (*pjVar3->error_exit)((j_common_ptr)cinfo);
        goto LAB_00106b87;
      }
      pcVar14 = get_8bit_row;
    }
    sinfo->get_pixel_rows = pcVar14;
  }
  else {
    pjVar12 = (*cinfo->mem->request_virt_sarray)((j_common_ptr)cinfo,1,0,uVar15,uVar19,1);
    sinfo[1].finish_input = (_func_void_j_compress_ptr_cjpeg_source_ptr *)pjVar12;
    sinfo->get_pixel_rows = preload_image;
    if (cinfo->progress != (jpeg_progress_mgr *)0x0) {
      piVar1 = (int *)((long)&cinfo->progress[1].progress_monitor + 4);
      *piVar1 = *piVar1 + 1;
    }
  }
LAB_00106b87:
  if ((long)cinfo->input_components * uVar17 >> 0x20 != 0) {
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x46;
    (*pjVar3->error_exit)((j_common_ptr)cinfo);
  }
  ppJVar10 = (*cinfo->mem->alloc_sarray)((j_common_ptr)cinfo,1,cinfo->input_components * uVar16,1);
  sinfo->buffer = ppJVar10;
  sinfo->buffer_height = 1;
  cinfo->data_precision = 8;
  cinfo->image_width = uVar16;
  cinfo->image_height = uVar19;
  return;
}

Assistant:

METHODDEF(void)
start_input_bmp(j_compress_ptr cinfo, cjpeg_source_ptr sinfo)
{
  bmp_source_ptr source = (bmp_source_ptr)sinfo;
  U_CHAR bmpfileheader[14];
  U_CHAR bmpinfoheader[64];

#define GET_2B(array, offset) \
  ((unsigned short)UCH(array[offset]) + \
   (((unsigned short)UCH(array[offset + 1])) << 8))
#define GET_4B(array, offset) \
  ((unsigned int)UCH(array[offset]) + \
   (((unsigned int)UCH(array[offset + 1])) << 8) + \
   (((unsigned int)UCH(array[offset + 2])) << 16) + \
   (((unsigned int)UCH(array[offset + 3])) << 24))

  int bfOffBits;
  int headerSize;
  int biWidth;
  int biHeight;
  unsigned short biPlanes;
  unsigned int biCompression;
  int biXPelsPerMeter, biYPelsPerMeter;
  int biClrUsed = 0;
  int mapentrysize = 0;         /* 0 indicates no colormap */
  int bPad;
  JDIMENSION row_width = 0;

  /* Read and verify the bitmap file header */
  if (!ReadOK(source->pub.input_file, bmpfileheader, 14))
    ERREXIT(cinfo, JERR_INPUT_EOF);
  if (GET_2B(bmpfileheader, 0) != 0x4D42) /* 'BM' */
    ERREXIT(cinfo, JERR_BMP_NOT);
  bfOffBits = GET_4B(bmpfileheader, 10);
  /* We ignore the remaining fileheader fields */

  /* The infoheader might be 12 bytes (OS/2 1.x), 40 bytes (Windows),
   * or 64 bytes (OS/2 2.x).  Check the first 4 bytes to find out which.
   */
  if (!ReadOK(source->pub.input_file, bmpinfoheader, 4))
    ERREXIT(cinfo, JERR_INPUT_EOF);
  headerSize = GET_4B(bmpinfoheader, 0);
  if (headerSize < 12 || headerSize > 64 || (headerSize + 14) > bfOffBits)
    ERREXIT(cinfo, JERR_BMP_BADHEADER);
  if (!ReadOK(source->pub.input_file, bmpinfoheader + 4, headerSize - 4))
    ERREXIT(cinfo, JERR_INPUT_EOF);

  switch (headerSize) {
  case 12:
    /* Decode OS/2 1.x header (Microsoft calls this a BITMAPCOREHEADER) */
    biWidth = (int)GET_2B(bmpinfoheader, 4);
    biHeight = (int)GET_2B(bmpinfoheader, 6);
    biPlanes = GET_2B(bmpinfoheader, 8);
    source->bits_per_pixel = (int)GET_2B(bmpinfoheader, 10);

    switch (source->bits_per_pixel) {
    case 8:                     /* colormapped image */
      mapentrysize = 3;         /* OS/2 uses RGBTRIPLE colormap */
      TRACEMS2(cinfo, 1, JTRC_BMP_OS2_MAPPED, biWidth, biHeight);
      break;
    case 24:                    /* RGB image */
    case 32:                    /* RGB image + Alpha channel */
      TRACEMS3(cinfo, 1, JTRC_BMP_OS2, biWidth, biHeight,
               source->bits_per_pixel);
      break;
    default:
      ERREXIT(cinfo, JERR_BMP_BADDEPTH);
      break;
    }
    break;
  case 40:
  case 64:
    /* Decode Windows 3.x header (Microsoft calls this a BITMAPINFOHEADER) */
    /* or OS/2 2.x header, which has additional fields that we ignore */
    biWidth = (int)GET_4B(bmpinfoheader, 4);
    biHeight = (int)GET_4B(bmpinfoheader, 8);
    biPlanes = GET_2B(bmpinfoheader, 12);
    source->bits_per_pixel = (int)GET_2B(bmpinfoheader, 14);
    biCompression = GET_4B(bmpinfoheader, 16);
    biXPelsPerMeter = (int)GET_4B(bmpinfoheader, 24);
    biYPelsPerMeter = (int)GET_4B(bmpinfoheader, 28);
    biClrUsed = GET_4B(bmpinfoheader, 32);
    /* biSizeImage, biClrImportant fields are ignored */

    switch (source->bits_per_pixel) {
    case 8:                     /* colormapped image */
      mapentrysize = 4;         /* Windows uses RGBQUAD colormap */
      TRACEMS2(cinfo, 1, JTRC_BMP_MAPPED, biWidth, biHeight);
      break;
    case 24:                    /* RGB image */
    case 32:                    /* RGB image + Alpha channel */
      TRACEMS3(cinfo, 1, JTRC_BMP, biWidth, biHeight, source->bits_per_pixel);
      break;
    default:
      ERREXIT(cinfo, JERR_BMP_BADDEPTH);
      break;
    }
    if (biCompression != 0)
      ERREXIT(cinfo, JERR_BMP_COMPRESSED);

    if (biXPelsPerMeter > 0 && biYPelsPerMeter > 0) {
      /* Set JFIF density parameters from the BMP data */
      cinfo->X_density = (UINT16)(biXPelsPerMeter / 100); /* 100 cm per meter */
      cinfo->Y_density = (UINT16)(biYPelsPerMeter / 100);
      cinfo->density_unit = 2;  /* dots/cm */
    }
    break;
  default:
    ERREXIT(cinfo, JERR_BMP_BADHEADER);
    return;
  }

  if (biWidth <= 0 || biHeight <= 0)
    ERREXIT(cinfo, JERR_BMP_EMPTY);
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
  if (sinfo->max_pixels &&
      (unsigned long long)biWidth * biHeight > sinfo->max_pixels)
    ERREXIT(cinfo, JERR_WIDTH_OVERFLOW);
#endif
  if (biPlanes != 1)
    ERREXIT(cinfo, JERR_BMP_BADPLANES);

  /* Compute distance to bitmap data --- will adjust for colormap below */
  bPad = bfOffBits - (headerSize + 14);

  /* Read the colormap, if any */
  if (mapentrysize > 0) {
    if (biClrUsed <= 0)
      biClrUsed = 256;          /* assume it's 256 */
    else if (biClrUsed > 256)
      ERREXIT(cinfo, JERR_BMP_BADCMAP);
    /* Allocate space to store the colormap */
    source->colormap = (*cinfo->mem->alloc_sarray)
      ((j_common_ptr)cinfo, JPOOL_IMAGE, (JDIMENSION)biClrUsed, (JDIMENSION)3);
    source->cmap_length = (int)biClrUsed;
    /* and read it from the file */
    read_colormap(source, (int)biClrUsed, mapentrysize);
    /* account for size of colormap */
    bPad -= biClrUsed * mapentrysize;
  }

  /* Skip any remaining pad bytes */
  if (bPad < 0)                 /* incorrect bfOffBits value? */
    ERREXIT(cinfo, JERR_BMP_BADHEADER);
  while (--bPad >= 0) {
    (void)read_byte(source);
  }

  /* Compute row width in file, including padding to 4-byte boundary */
  switch (source->bits_per_pixel) {
  case 8:
    if (cinfo->in_color_space == JCS_UNKNOWN)
      cinfo->in_color_space = JCS_EXT_RGB;
    if (IsExtRGB(cinfo->in_color_space))
      cinfo->input_components = rgb_pixelsize[cinfo->in_color_space];
    else if (cinfo->in_color_space == JCS_GRAYSCALE)
      cinfo->input_components = 1;
    else if (cinfo->in_color_space == JCS_CMYK)
      cinfo->input_components = 4;
    else
      ERREXIT(cinfo, JERR_BAD_IN_COLORSPACE);
    row_width = (JDIMENSION)biWidth;
    break;
  case 24:
    if (cinfo->in_color_space == JCS_UNKNOWN)
      cinfo->in_color_space = JCS_EXT_BGR;
    if (IsExtRGB(cinfo->in_color_space))
      cinfo->input_components = rgb_pixelsize[cinfo->in_color_space];
    else if (cinfo->in_color_space == JCS_CMYK)
      cinfo->input_components = 4;
    else
      ERREXIT(cinfo, JERR_BAD_IN_COLORSPACE);
    if ((unsigned long long)biWidth * 3ULL > 0xFFFFFFFFULL)
      ERREXIT(cinfo, JERR_WIDTH_OVERFLOW);
    row_width = (JDIMENSION)biWidth * 3;
    break;
  case 32:
    if (cinfo->in_color_space == JCS_UNKNOWN)
      cinfo->in_color_space = JCS_EXT_BGRA;
    if (IsExtRGB(cinfo->in_color_space))
      cinfo->input_components = rgb_pixelsize[cinfo->in_color_space];
    else if (cinfo->in_color_space == JCS_CMYK)
      cinfo->input_components = 4;
    else
      ERREXIT(cinfo, JERR_BAD_IN_COLORSPACE);
    if ((unsigned long long)biWidth * 4ULL > 0xFFFFFFFFULL)
      ERREXIT(cinfo, JERR_WIDTH_OVERFLOW);
    row_width = (JDIMENSION)biWidth * 4;
    break;
  default:
    ERREXIT(cinfo, JERR_BMP_BADDEPTH);
  }
  while ((row_width & 3) != 0) row_width++;
  source->row_width = row_width;

  if (source->use_inversion_array) {
    /* Allocate space for inversion array, prepare for preload pass */
    source->whole_image = (*cinfo->mem->request_virt_sarray)
      ((j_common_ptr)cinfo, JPOOL_IMAGE, FALSE,
       row_width, (JDIMENSION)biHeight, (JDIMENSION)1);
    source->pub.get_pixel_rows = preload_image;
    if (cinfo->progress != NULL) {
      cd_progress_ptr progress = (cd_progress_ptr)cinfo->progress;
      progress->total_extra_passes++; /* count file input as separate pass */
    }
  } else {
    source->iobuffer = (U_CHAR *)
      (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE, row_width);
    switch (source->bits_per_pixel) {
    case 8:
      source->pub.get_pixel_rows = get_8bit_row;
      break;
    case 24:
      source->pub.get_pixel_rows = get_24bit_row;
      break;
    case 32:
      source->pub.get_pixel_rows = get_32bit_row;
      break;
    default:
      ERREXIT(cinfo, JERR_BMP_BADDEPTH);
    }
  }

  /* Ensure that biWidth * cinfo->input_components doesn't exceed the maximum
     value of the JDIMENSION type.  This is only a danger with BMP files, since
     their width and height fields are 32-bit integers. */
  if ((unsigned long long)biWidth *
      (unsigned long long)cinfo->input_components > 0xFFFFFFFFULL)
    ERREXIT(cinfo, JERR_WIDTH_OVERFLOW);
  /* Allocate one-row buffer for returned data */
  source->pub.buffer = (*cinfo->mem->alloc_sarray)
    ((j_common_ptr)cinfo, JPOOL_IMAGE,
     (JDIMENSION)biWidth * (JDIMENSION)cinfo->input_components, (JDIMENSION)1);
  source->pub.buffer_height = 1;

  cinfo->data_precision = 8;
  cinfo->image_width = (JDIMENSION)biWidth;
  cinfo->image_height = (JDIMENSION)biHeight;
}